

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O0

QSize __thiscall QFrame::sizeHint(QFrame *this)

{
  long lVar1;
  uint uVar2;
  QFramePrivate *pQVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QFramePrivate *d;
  undefined8 in_stack_ffffffffffffffc8;
  int w;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QFrame *)0x49e35a);
  uVar2 = pQVar3->frameStyle & 0xf;
  w = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (uVar2 == 4) {
    QSize::QSize((QSize *)in_RDI,w,(int)in_stack_ffffffffffffffc8);
  }
  else if (uVar2 == 5) {
    QSize::QSize((QSize *)in_RDI,w,(int)in_stack_ffffffffffffffc8);
  }
  else {
    local_10 = QWidget::sizeHint(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QFrame::sizeHint() const
{
    Q_D(const QFrame);
    //   Returns a size hint for the frame - for HLine and VLine
    //   shapes, this is stretchable one way and 3 pixels wide the
    //   other.  For other shapes, QWidget::sizeHint() is used.
    switch (d->frameStyle & Shape_Mask) {
    case HLine:
        return QSize(-1,3);
    case VLine:
        return QSize(3,-1);
    default:
        return QWidget::sizeHint();
    }
}